

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  long lVar25;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar27 [32];
  int i_3;
  int j;
  int i_2;
  __m128i t4;
  __m256i t2;
  __m256i t1;
  __m256i x;
  int k_1;
  int k;
  int i_1;
  uint32_t pos;
  uint32_t n_update_cycles;
  uint32_t n_cycles;
  __m256i *data_vectors;
  __m256i lo_mask;
  __m256i hi_mask;
  uint32_t out_counters [16];
  int i;
  __m256i counters [16];
  __m256i masks [16];
  int local_159c;
  int local_1598;
  uint local_1594;
  int local_1520;
  int local_151c;
  uint local_1518;
  uint local_1514;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14c0 [64];
  uint local_1444;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined8 local_1240 [528];
  int local_1c0;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  for (local_1444 = 0; (int)local_1444 < 0x10; local_1444 = local_1444 + 1) {
    uVar24 = 1 << (local_1444 & 0x1f);
    auVar28 = vpinsrw_avx(ZEXT216((ushort)uVar24),uVar24 & 0xffff,1);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,2);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,3);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,4);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,5);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,6);
    auVar28 = vpinsrw_avx(auVar28,uVar24 & 0xffff,7);
    auVar26 = vpinsrw_avx(ZEXT216((ushort)uVar24),uVar24 & 0xffff,1);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,2);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,3);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,4);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,5);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,6);
    auVar26 = vpinsrw_avx(auVar26,uVar24 & 0xffff,7);
    local_1a0 = auVar28._0_8_;
    uStack_198 = auVar28._8_8_;
    uStack_190 = auVar26._0_8_;
    uStack_188 = auVar26._8_8_;
    lVar25 = (long)(int)local_1444;
    local_1240[lVar25 * 4] = local_1a0;
    local_1240[lVar25 * 4 + 1] = uStack_198;
    local_1240[lVar25 * 4 + 2] = uStack_190;
    local_1240[lVar25 * 4 + 3] = uStack_188;
    auVar28 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar28 = vpinsrw_avx(auVar28,0,2);
    auVar28 = vpinsrw_avx(auVar28,0,3);
    auVar28 = vpinsrw_avx(auVar28,0,4);
    auVar28 = vpinsrw_avx(auVar28,0,5);
    auVar28 = vpinsrw_avx(auVar28,0,6);
    auVar28 = vpinsrw_avx(auVar28,0,7);
    auVar26 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar26 = vpinsrw_avx(auVar26,0,2);
    auVar26 = vpinsrw_avx(auVar26,0,3);
    auVar26 = vpinsrw_avx(auVar26,0,4);
    auVar26 = vpinsrw_avx(auVar26,0,5);
    auVar26 = vpinsrw_avx(auVar26,0,6);
    auVar26 = vpinsrw_avx(auVar26,0,7);
    auVar26 = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar26;
    auVar28 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar28;
    local_160 = auVar26._0_8_;
    uStack_158 = auVar26._8_8_;
    uStack_150 = auVar28._0_8_;
    uStack_148 = auVar28._8_8_;
    lVar25 = (long)(int)local_1444 * 0x20;
    *(undefined8 *)(local_1440 + lVar25) = local_160;
    *(undefined8 *)(local_1440 + lVar25 + 8) = uStack_158;
    *(undefined8 *)(local_1440 + lVar25 + 0x10) = uStack_150;
    *(undefined8 *)(local_1420 + lVar25 + -8) = uStack_148;
  }
  local_14c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar28 = vpinsrd_avx(ZEXT416(0xffff0000),0xffff0000,1);
  auVar28 = vpinsrd_avx(auVar28,0xffff0000,2);
  auVar28 = vpinsrd_avx(auVar28,0xffff0000,3);
  auVar26 = vpinsrd_avx(ZEXT416(0xffff0000),0xffff0000,1);
  auVar26 = vpinsrd_avx(auVar26,0xffff0000,2);
  auVar26 = vpinsrd_avx(auVar26,0xffff0000,3);
  uStack_d0 = auVar26._0_8_;
  uStack_c8 = auVar26._8_8_;
  auVar26 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
  auVar26 = vpinsrd_avx(auVar26,0xffff,2);
  auVar26 = vpinsrd_avx(auVar26,0xffff,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
  auVar2 = vpinsrd_avx(auVar2,0xffff,2);
  auVar2 = vpinsrd_avx(auVar2,0xffff,3);
  auVar29 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
  local_1514 = 0;
  for (local_1518 = 0; local_1518 < in_ESI >> 0x14; local_1518 = local_1518 + 1) {
    for (local_151c = 0; local_151c < 0x10000; local_151c = local_151c + 1) {
      auVar23._8_8_ = local_1240[1];
      auVar23._0_8_ = local_1240[0];
      auVar23._16_8_ = local_1240[2];
      auVar23._24_8_ = local_1240[3];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar23);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0));
      local_1440 = vpaddw_avx2(local_1440,auVar4);
      auVar22._8_8_ = local_1240[5];
      auVar22._0_8_ = local_1240[4];
      auVar22._16_8_ = local_1240[6];
      auVar22._24_8_ = local_1240[7];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar22);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(1));
      local_1420 = vpaddw_avx2(local_1420,auVar4);
      auVar21._8_8_ = local_1240[9];
      auVar21._0_8_ = local_1240[8];
      auVar21._16_8_ = local_1240[10];
      auVar21._24_8_ = local_1240[0xb];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar21);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(2));
      local_1400 = vpaddw_avx2(local_1400,auVar4);
      auVar20._8_8_ = local_1240[0xd];
      auVar20._0_8_ = local_1240[0xc];
      auVar20._16_8_ = local_1240[0xe];
      auVar20._24_8_ = local_1240[0xf];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar20);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(3));
      local_13e0 = vpaddw_avx2(local_13e0,auVar4);
      auVar19._8_8_ = local_1240[0x11];
      auVar19._0_8_ = local_1240[0x10];
      auVar19._16_8_ = local_1240[0x12];
      auVar19._24_8_ = local_1240[0x13];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar19);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(4));
      local_13c0 = vpaddw_avx2(local_13c0,auVar4);
      auVar18._8_8_ = local_1240[0x15];
      auVar18._0_8_ = local_1240[0x14];
      auVar18._16_8_ = local_1240[0x16];
      auVar18._24_8_ = local_1240[0x17];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar18);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(5));
      local_13a0 = vpaddw_avx2(local_13a0,auVar4);
      auVar17._8_8_ = local_1240[0x19];
      auVar17._0_8_ = local_1240[0x18];
      auVar17._16_8_ = local_1240[0x1a];
      auVar17._24_8_ = local_1240[0x1b];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar17);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(6));
      local_1380 = vpaddw_avx2(local_1380,auVar4);
      auVar16._8_8_ = local_1240[0x1d];
      auVar16._0_8_ = local_1240[0x1c];
      auVar16._16_8_ = local_1240[0x1e];
      auVar16._24_8_ = local_1240[0x1f];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar16);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(7));
      local_1360 = vpaddw_avx2(local_1360,auVar4);
      auVar15._8_8_ = local_1240[0x21];
      auVar15._0_8_ = local_1240[0x20];
      auVar15._16_8_ = local_1240[0x22];
      auVar15._24_8_ = local_1240[0x23];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar15);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(8));
      local_1340 = vpaddw_avx2(local_1340,auVar4);
      auVar14._8_8_ = local_1240[0x25];
      auVar14._0_8_ = local_1240[0x24];
      auVar14._16_8_ = local_1240[0x26];
      auVar14._24_8_ = local_1240[0x27];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar14);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(9));
      local_1320 = vpaddw_avx2(local_1320,auVar4);
      auVar13._8_8_ = local_1240[0x29];
      auVar13._0_8_ = local_1240[0x28];
      auVar13._16_8_ = local_1240[0x2a];
      auVar13._24_8_ = local_1240[0x2b];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar13);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(10));
      local_1300 = vpaddw_avx2(local_1300,auVar4);
      auVar12._8_8_ = local_1240[0x2d];
      auVar12._0_8_ = local_1240[0x2c];
      auVar12._16_8_ = local_1240[0x2e];
      auVar12._24_8_ = local_1240[0x2f];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar12);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0xb));
      local_12e0 = vpaddw_avx2(local_12e0,auVar4);
      auVar11._8_8_ = local_1240[0x31];
      auVar11._0_8_ = local_1240[0x30];
      auVar11._16_8_ = local_1240[0x32];
      auVar11._24_8_ = local_1240[0x33];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar11);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0xc));
      local_12c0 = vpaddw_avx2(local_12c0,auVar4);
      auVar10._8_8_ = local_1240[0x35];
      auVar10._0_8_ = local_1240[0x34];
      auVar10._16_8_ = local_1240[0x36];
      auVar10._24_8_ = local_1240[0x37];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar10);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0xd));
      local_12a0 = vpaddw_avx2(local_12a0,auVar4);
      auVar9._8_8_ = local_1240[0x39];
      auVar9._0_8_ = local_1240[0x38];
      auVar9._16_8_ = local_1240[0x3a];
      auVar9._24_8_ = local_1240[0x3b];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar9);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0xe));
      local_1280 = vpaddw_avx2(local_1280,auVar4);
      auVar8._8_8_ = local_1240[0x3d];
      auVar8._0_8_ = local_1240[0x3c];
      auVar8._16_8_ = local_1240[0x3e];
      auVar8._24_8_ = local_1240[0x3f];
      auVar4 = vpand_avx2(*(undefined1 (*) [32])(in_RDI + (ulong)local_1514 * 0x20),auVar8);
      auVar4 = vpsrlw_avx2(auVar4,ZEXT416(0xf));
      local_1260 = vpaddw_avx2(local_1260,auVar4);
      local_1514 = local_1514 + 1;
    }
    for (local_1520 = 0; local_1520 < 0x10; local_1520 = local_1520 + 1) {
      lVar25 = (long)local_1520 * 0x20;
      auVar7._8_8_ = *(undefined8 *)(local_1440 + lVar25 + 8);
      auVar7._0_8_ = *(undefined8 *)(local_1440 + lVar25);
      auVar7._16_8_ = *(undefined8 *)(local_1440 + lVar25 + 0x10);
      auVar7._24_8_ = *(undefined8 *)(local_1420 + lVar25 + -8);
      auVar5._16_8_ = uStack_d0;
      auVar5._0_16_ = auVar28;
      auVar5._24_8_ = uStack_c8;
      auVar4 = vpand_avx2(auVar7,auVar5);
      auVar5 = vpsrld_avx2(auVar4,ZEXT416(0x10));
      lVar25 = (long)local_1520 * 0x20;
      uStack_14f0 = auVar29._0_8_;
      uStack_14e8 = auVar29._8_8_;
      auVar6._8_8_ = *(undefined8 *)(local_1440 + lVar25 + 8);
      auVar6._0_8_ = *(undefined8 *)(local_1440 + lVar25);
      auVar6._16_8_ = *(undefined8 *)(local_1440 + lVar25 + 0x10);
      auVar6._24_8_ = *(undefined8 *)(local_1420 + lVar25 + -8);
      auVar4._16_8_ = uStack_14f0;
      auVar4._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar2;
      auVar4._24_8_ = uStack_14e8;
      auVar4 = vpand_avx2(auVar6,auVar4);
      auVar4 = vpaddd_avx2(auVar5,auVar4);
      auVar4 = vphaddd_avx2(auVar4,auVar4);
      auVar4 = vphaddd_avx2(auVar4,auVar4);
      auVar1 = vpaddd_avx(auVar4._0_16_,auVar4._16_16_);
      local_1c0 = auVar1._0_4_;
      *(int *)(local_14c0 + (long)local_1520 * 4) =
           *(int *)(local_14c0 + (long)local_1520 * 4) + local_1c0;
      auVar1 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar1 = vpinsrw_avx(auVar1,0,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      auVar1 = vpinsrw_avx(auVar1,0,4);
      auVar1 = vpinsrw_avx(auVar1,0,5);
      auVar1 = vpinsrw_avx(auVar1,0,6);
      auVar1 = vpinsrw_avx(auVar1,0,7);
      auVar3 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar3 = vpinsrw_avx(auVar3,0,2);
      auVar3 = vpinsrw_avx(auVar3,0,3);
      auVar3 = vpinsrw_avx(auVar3,0,4);
      auVar3 = vpinsrw_avx(auVar3,0,5);
      auVar3 = vpinsrw_avx(auVar3,0,6);
      auVar3 = vpinsrw_avx(auVar3,0,7);
      auVar27._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
      auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      *(undefined1 (*) [32])(local_1440 + (long)local_1520 * 0x20) = auVar27;
    }
  }
  for (local_1594 = local_1514 << 4; local_1594 < in_ESI; local_1594 = local_1594 + 1) {
    for (local_1598 = 0; local_1598 < 0x10; local_1598 = local_1598 + 1) {
      *(int *)(local_14c0 + (long)local_1598 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + (long)(int)local_1594 * 2) &
                 1 << ((byte)local_1598 & 0x1f)) >> ((byte)local_1598 & 0x1f)) +
           *(int *)(local_14c0 + (long)local_1598 * 4);
    }
  }
  for (local_159c = 0; local_159c < 0x10; local_159c = local_159c + 1) {
    *(undefined4 *)(in_RDX + (long)local_159c * 4) =
         *(undefined4 *)(local_14c0 + (long)local_159c * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i hi_mask = _mm256_set1_epi32(0xFFFF0000);
    const __m256i lo_mask = _mm256_set1_epi32(0x0000FFFF);
    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))
#define ITERATION  {                               \
    UPDATE(0);  UPDATE(1);  UPDATE(2);  UPDATE(3); \
    UPDATE(4);  UPDATE(5);  UPDATE(6);  UPDATE(7); \
    UPDATE(8);  UPDATE(9);  UPDATE(10); UPDATE(11);\
    UPDATE(12); UPDATE(13); UPDATE(14); UPDATE(15);\
    ++pos;                                         \
}
    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++k) // max sum of each 16-bit value in a register
            ITERATION // unrolled

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Accumulator
            // ((16-bit high & 16 high) >> 16) + (16-bit low & 16-low)
            __m256i x = _mm256_add_epi32(
                           _mm256_srli_epi32(_mm256_and_si256(counters[k], hi_mask), 16),
                           _mm256_and_si256(counters[k], lo_mask));
            __m256i t1 = _mm256_hadd_epi32(x,x);
            __m256i t2 = _mm256_hadd_epi32(t1,t1);
            __m128i t4 = _mm_add_epi32(_mm256_castsi256_si128(t2),_mm256_extractf128_si256(t2,1));
            out_counters[k] += _mm_cvtsi128_si32(t4);

            /*
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) { // each uint16_t in the register
                out_counters[k] += d[j];
            }
            */

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (int i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef ITERATION
#undef UPDATE

    return 0;
}